

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver3.c
# Opt level: O2

int sat_solver3_minimize_assumptions(sat_solver3 *s,int *pLits,int nLits,int nConfLimit)

{
  int *pLits_00;
  ABC_INT64_T AVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  ulong uVar6;
  
  do {
    if (nLits == 1) {
      AVar1 = s->nConfLimit;
      s->nConfLimit = (long)nConfLimit;
      iVar2 = sat_solver3_solve_internal(s);
      s->nConfLimit = (long)(int)AVar1;
      return (uint)(iVar2 != -1);
    }
    if (nLits < 2) {
      __assert_fail("nLits >= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver3.c"
                    ,0x865,"int sat_solver3_minimize_assumptions(sat_solver3 *, int *, int, int)");
    }
    uVar5 = (uint)nLits >> 1;
    uVar6 = (ulong)uVar5;
    uVar8 = 0;
LAB_00727e3d:
    if (uVar6 == uVar8) {
      uVar3 = sat_solver3_minimize_assumptions(s,pLits + uVar6,nLits - uVar5,nConfLimit);
      uVar7 = uVar5;
      while (bVar9 = uVar7 != 0, uVar7 = uVar7 - 1, bVar9) {
        sat_solver3_pop(s);
      }
      veci_resize(&s->temp_clause,0);
      for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
        veci_push(&s->temp_clause,pLits[uVar8]);
      }
      uVar8 = 0;
      if (0 < (int)uVar3) {
        uVar8 = (ulong)uVar3;
      }
      for (uVar4 = 0; uVar8 != uVar4; uVar4 = uVar4 + 1) {
        pLits[uVar4] = (pLits + uVar6)[uVar4];
      }
      uVar4 = (ulong)(int)uVar3;
      pLits_00 = pLits + uVar4;
      for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
        pLits_00[uVar8] = (s->temp_clause).ptr[uVar8];
      }
      if ((long)uVar4 < 1) {
        uVar4 = 0;
      }
      uVar8 = 0;
      while( true ) {
        if (uVar4 == uVar8) {
          iVar2 = sat_solver3_minimize_assumptions(s,pLits_00,uVar5,nConfLimit);
          uVar5 = 0;
          if (0 < (int)uVar3) {
            uVar5 = uVar3;
          }
          while (bVar9 = uVar5 != 0, uVar5 = uVar5 - 1, bVar9) {
            sat_solver3_pop(s);
          }
          return iVar2 + uVar3;
        }
        iVar2 = sat_solver3_push(s,pLits[uVar8]);
        if (iVar2 == 0) break;
        uVar8 = uVar8 + 1;
      }
      for (uVar6 = uVar8 & 0xffffffff; -1 < (int)uVar6; uVar6 = (ulong)((int)uVar6 - 1)) {
        sat_solver3_pop(s);
      }
    }
    else {
      iVar2 = sat_solver3_push(s,pLits[uVar8]);
      if (iVar2 != 0) break;
      for (uVar6 = uVar8 & 0xffffffff; -1 < (int)uVar6; uVar6 = (ulong)((int)uVar6 - 1)) {
        sat_solver3_pop(s);
      }
      uVar8 = uVar8 & 0xffffffff;
    }
    nLits = (int)uVar8 + 1;
  } while( true );
  uVar8 = uVar8 + 1;
  goto LAB_00727e3d;
}

Assistant:

int sat_solver3_minimize_assumptions( sat_solver3* s, int * pLits, int nLits, int nConfLimit )
{
    int i, k, nLitsL, nLitsR, nResL, nResR;
    if ( nLits == 1 )
    {
        // since the problem is UNSAT, we will try to solve it without assuming the last literal
        // if the result is UNSAT, the last literal can be dropped; otherwise, it is needed
        int status = l_False;
        int Temp = s->nConfLimit; 
        s->nConfLimit = nConfLimit;
        status = sat_solver3_solve_internal( s );
        s->nConfLimit = Temp;
        return (int)(status != l_False); // return 1 if the problem is not UNSAT
    }
    assert( nLits >= 2 );
    nLitsL = nLits / 2;
    nLitsR = nLits - nLitsL;
    // assume the left lits
    for ( i = 0; i < nLitsL; i++ )
        if ( !sat_solver3_push(s, pLits[i]) )
        {
            for ( k = i; k >= 0; k-- )
                sat_solver3_pop(s);
            return sat_solver3_minimize_assumptions( s, pLits, i+1, nConfLimit );
        }
    // solve for the right lits
    nResL = sat_solver3_minimize_assumptions( s, pLits + nLitsL, nLitsR, nConfLimit );
    for ( i = 0; i < nLitsL; i++ )
        sat_solver3_pop(s);
    // swap literals
//    assert( nResL <= nLitsL );
//    for ( i = 0; i < nResL; i++ )
//        ABC_SWAP( int, pLits[i], pLits[nLitsL+i] );
    veci_resize( &s->temp_clause, 0 );
    for ( i = 0; i < nLitsL; i++ )
        veci_push( &s->temp_clause, pLits[i] );
    for ( i = 0; i < nResL; i++ )
        pLits[i] = pLits[nLitsL+i];
    for ( i = 0; i < nLitsL; i++ )
        pLits[nResL+i] = veci_begin(&s->temp_clause)[i];
    // assume the right lits
    for ( i = 0; i < nResL; i++ )
        if ( !sat_solver3_push(s, pLits[i]) )
        {
            for ( k = i; k >= 0; k-- )
                sat_solver3_pop(s);
            return sat_solver3_minimize_assumptions( s, pLits, i+1, nConfLimit );
        }
    // solve for the left lits
    nResR = sat_solver3_minimize_assumptions( s, pLits + nResL, nLitsL, nConfLimit );
    for ( i = 0; i < nResL; i++ )
        sat_solver3_pop(s);
    return nResL + nResR;
}